

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

int dlep_session_add(dlep_session *session,char *l2_ifname,oonf_layer2_origin *l2_origin,
                    oonf_layer2_origin *l2_default_origin,autobuf *out,_Bool radio,
                    _func_int_os_interface_listener_ptr *if_changed,oonf_log_source log_source)

{
  list_entity *plVar1;
  list_entity *plVar2;
  int iVar3;
  os_interface *poVar4;
  dlep_parser_value *pdVar5;
  avl_tree *paVar6;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_extension *ext;
  dlep_session_parser *parser;
  _Bool radio_local;
  autobuf *out_local;
  oonf_layer2_origin *l2_default_origin_local;
  oonf_layer2_origin *l2_origin_local;
  char *l2_ifname_local;
  dlep_session *session_local;
  
  avl_init(&session->parser,avl_comp_uint16,0,l2_default_origin,out,if_changed);
  avl_init(&session->local_neighbor_tree,oonf_layer2_avlcmp_neigh_key,0);
  session->log_source = log_source;
  session->l2_origin = l2_origin;
  session->l2_default_origin = l2_default_origin;
  session->radio = radio;
  (session->writer).out = out;
  session->_peer_state = DLEP_PEER_WAIT_FOR_INIT;
  (session->l2_listener).name = l2_ifname;
  (session->l2_listener).if_changed = if_changed;
  poVar4 = os_interface_linux_add(&session->l2_listener);
  if (poVar4 == (os_interface *)0x0) {
    if (((&log_global_mask)[session->log_source] & 4) != 0) {
      oonf_log(4,session->log_source,"src/generic/dlep/dlep_session.c",0x92,0,0,
               "Cannot activate interface listener for %s",l2_ifname);
    }
    dlep_session_remove(session);
    session_local._4_4_ = -1;
  }
  else {
    pdVar5 = (dlep_parser_value *)calloc(0x80,8);
    (session->parser).values = pdVar5;
    if ((session->parser).values == (dlep_parser_value *)0x0) {
      if (((&log_global_mask)[session->log_source] & 4) != 0) {
        oonf_log(4,session->log_source,"src/generic/dlep/dlep_session.c",0x99,0,0,
                 "Cannot allocate values buffer for %s",l2_ifname);
      }
      dlep_session_remove(session);
      session_local._4_4_ = -1;
    }
    else {
      paVar6 = dlep_extension_get_tree();
      plVar1 = (paVar6->list_head).next;
      while( true ) {
        __tempptr = plVar1 + -9;
        plVar2 = plVar1->prev;
        paVar6 = dlep_extension_get_tree();
        if (plVar2 == (paVar6->list_head).prev) break;
        if (((&log_global_mask)[session->log_source] & 1) != 0) {
          oonf_log(1,session->log_source,"src/generic/dlep/dlep_session.c",0xa0,0,0,
                   "Add extension %d to session",*(undefined4 *)&__tempptr->next);
        }
        (session->parser).extensions[(session->parser).extension_count] =
             (dlep_extension *)__tempptr;
        (session->parser).extension_count = (session->parser).extension_count + 1;
        plVar1 = plVar1->next;
      }
      iVar3 = _update_allowed_tlvs(session);
      if (iVar3 == 0) {
        avl_init(&session->_ext_ip,avl_comp_netaddr,0);
        if (((&log_global_mask)[session->log_source] & 2) != 0) {
          oonf_log(2,session->log_source,"src/generic/dlep/dlep_session.c",0xad,0,0,
                   "Add session on %s",(session->l2_listener).name);
        }
        session_local._4_4_ = 0;
      }
      else {
        if (((&log_global_mask)[session->log_source] & 4) != 0) {
          oonf_log(4,session->log_source,"src/generic/dlep/dlep_session.c",0xa6,0,0,
                   "Could not update allowed TLVs for %s",l2_ifname);
        }
        dlep_session_remove(session);
        session_local._4_4_ = -1;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int
dlep_session_add(struct dlep_session *session, const char *l2_ifname, const struct oonf_layer2_origin *l2_origin,
  const struct oonf_layer2_origin *l2_default_origin, struct autobuf *out, bool radio,
  int (*if_changed)(struct os_interface_listener *), enum oonf_log_source log_source) {
  struct dlep_session_parser *parser;
  struct dlep_extension *ext;

  parser = &session->parser;

  avl_init(&parser->allowed_tlvs, avl_comp_uint16, false);
  avl_init(&session->local_neighbor_tree, oonf_layer2_avlcmp_neigh_key, false);

  session->log_source = log_source;
  session->l2_origin = l2_origin;
  session->l2_default_origin = l2_default_origin;
  session->radio = radio;
  session->writer.out = out;
  session->_peer_state = DLEP_PEER_WAIT_FOR_INIT;

  /* remember interface name */
  session->l2_listener.name = l2_ifname;
  session->l2_listener.if_changed = if_changed;

  /* get interface listener to lock interface */
  if (!os_interface_add(&session->l2_listener)) {
    OONF_WARN(session->log_source, "Cannot activate interface listener for %s", l2_ifname);
    dlep_session_remove(session);
    return -1;
  }

  parser->values = calloc(SESSION_VALUE_STEP, sizeof(struct dlep_parser_value));
  if (!parser->values) {
    OONF_WARN(session->log_source, "Cannot allocate values buffer for %s", l2_ifname);
    dlep_session_remove(session);
    return -1;
  }

  /* generate full list of extensions */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    OONF_DEBUG(session->log_source, "Add extension %d to session", ext->id);
    parser->extensions[parser->extension_count] = ext;
    parser->extension_count++;
  }

  if (_update_allowed_tlvs(session)) {
    OONF_WARN(session->log_source, "Could not update allowed TLVs for %s", l2_ifname);
    dlep_session_remove(session);
    return -1;
  }

  avl_init(&session->_ext_ip.prefix_modification, avl_comp_netaddr, false);

  OONF_INFO(session->log_source, "Add session on %s", session->l2_listener.name);
  return 0;
}